

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void walIndexClose(Wal *pWal,int isDelete)

{
  u8 uVar1;
  long lVar2;
  
  uVar1 = pWal->exclusiveMode;
  if ((uVar1 == '\x02') || (pWal->bShmUnreliable != '\0')) {
    if (0 < pWal->nWiData) {
      lVar2 = 0;
      do {
        sqlite3_free(pWal->apWiData[lVar2]);
        pWal->apWiData[lVar2] = (u32 *)0x0;
        lVar2 = lVar2 + 1;
      } while (lVar2 < pWal->nWiData);
      uVar1 = pWal->exclusiveMode;
    }
    if (uVar1 == '\x02') {
      return;
    }
  }
  (*pWal->pDbFd->pMethods->xShmUnmap)(pWal->pDbFd,isDelete);
  return;
}

Assistant:

static void walIndexClose(Wal *pWal, int isDelete){
  if( pWal->exclusiveMode==WAL_HEAPMEMORY_MODE || pWal->bShmUnreliable ){
    int i;
    for(i=0; i<pWal->nWiData; i++){
      sqlite3_free((void *)pWal->apWiData[i]);
      pWal->apWiData[i] = 0;
    }
  }
  if( pWal->exclusiveMode!=WAL_HEAPMEMORY_MODE ){
    sqlite3OsShmUnmap(pWal->pDbFd, isDelete);
  }
}